

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCluster.cpp
# Opt level: O2

string * __thiscall
TypeCluster::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,TypeCluster *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  _Rb_tree_header *p_Var3;
  stringstream ss;
  string asStack_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::operator<<(local_1a8,"tcI");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"={ ");
  p_Var2 = (this->_m_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->_m_types)._M_t._M_impl.super__Rb_tree_header;
  while ((_Rb_tree_header *)p_Var2 != p_Var3) {
    (**(code **)(**(long **)(p_Var2 + 1) + 0x18))(asStack_1d8);
    std::operator<<(local_1a8,asStack_1d8);
    std::__cxx11::string::~string(asStack_1d8);
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      std::operator<<(local_1a8," | ");
    }
  }
  std::operator<<(local_1a8," }");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

string TypeCluster::SoftPrint() const
{
    stringstream ss;
    ss << "tcI"<<_m_i<<"={ ";

    type_ci it = _m_types.begin();
    type_ci last = _m_types.end();

    while(it != last)
    {
        ss << (*it)->SoftPrint();        
        it++;
        if(it != last)
            ss << " | ";       
    }
    ss << " }";
    return(ss.str());
}